

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O3

void __thiscall
Assimp::ComputeUVMappingProcess::ComputePlaneMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  float fVar1;
  undefined8 uVar2;
  aiVector3D *paVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  aiVector3D local_c8;
  aiVector3D local_b8;
  aiVector3D local_a8;
  aiMatrix4x4 local_98;
  aiMatrix3x3t<float> local_58;
  
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  local_c8.z = 0.0;
  fVar1 = axis->x;
  fVar9 = axis->y * 0.0;
  fVar13 = axis->z * 0.0;
  if (0.95 <= fVar1 + fVar9 + fVar13) {
    FindMeshCenter(mesh,&local_a8,&local_b8,&local_c8);
    if (mesh->mNumVertices != 0) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar2 = *(undefined8 *)((long)&mesh->mVertices->y + lVar7);
        auVar10._0_4_ = (float)uVar2 - local_b8.y;
        auVar10._4_4_ = (float)((ulong)uVar2 >> 0x20) - local_b8.z;
        auVar10._8_8_ = 0;
        auVar15._4_4_ = local_c8.z - local_b8.z;
        auVar15._0_4_ = local_c8.y - local_b8.y;
        auVar15._8_8_ = 0;
        auVar15 = divps(auVar10,auVar15);
        *(ulong *)((long)&out->x + lVar7) = CONCAT44(auVar15._0_4_,auVar15._4_4_);
        *(undefined4 *)((long)&out->z + lVar7) = 0;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar8 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= fVar13 + fVar1 * 0.0 + axis->y) {
    FindMeshCenter(mesh,&local_a8,&local_b8,&local_c8);
    if (mesh->mNumVertices != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        auVar11._0_4_ = *(float *)((long)mesh->mVertices + lVar7 + -8) - local_b8.x;
        auVar11._4_4_ = *(float *)((long)&mesh->mVertices->x + lVar7) - local_b8.z;
        auVar11._8_8_ = 0;
        auVar6._4_4_ = local_c8.z - local_b8.z;
        auVar6._0_4_ = local_c8.x - local_b8.x;
        auVar6._8_8_ = 0;
        auVar15 = divps(auVar11,auVar6);
        *(long *)((long)out + lVar7 + -8) = auVar15._0_8_;
        *(undefined4 *)((long)&out->x + lVar7) = 0;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar8 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= axis->z + fVar1 * 0.0 + fVar9) {
    FindMeshCenter(mesh,&local_a8,&local_b8,&local_c8);
    if (mesh->mNumVertices != 0) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        uVar2 = *(undefined8 *)((long)&mesh->mVertices->x + lVar7);
        auVar12._0_4_ = (float)uVar2 - local_b8.x;
        auVar12._4_4_ = (float)((ulong)uVar2 >> 0x20) - local_b8.y;
        auVar12._8_8_ = 0;
        auVar5._4_4_ = local_c8.y - local_b8.y;
        auVar5._0_4_ = local_c8.x - local_b8.x;
        auVar5._8_8_ = 0;
        auVar15 = divps(auVar12,auVar5);
        *(long *)((long)&out->x + lVar7) = auVar15._0_8_;
        *(undefined4 *)((long)&out->z + lVar7) = 0;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar8 < mesh->mNumVertices);
    }
  }
  else {
    local_58.a1 = 1.0;
    local_58.a2 = 0.0;
    local_58.a3 = 0.0;
    local_58.b1 = 0.0;
    local_58.b2 = 1.0;
    local_58.b3 = 0.0;
    local_58.c1 = 0.0;
    local_58.c2 = 0.0;
    local_58.c3 = 1.0;
    aiMatrix3x3t<float>::FromToMatrix
              (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,&local_58);
    local_98.a1 = local_58.a1;
    local_98.a2 = local_58.a2;
    local_98.a3 = local_58.a3;
    local_98.a4 = 0.0;
    local_98.b1 = local_58.b1;
    local_98.b2 = local_58.b2;
    local_98.b3 = local_58.b3;
    local_98.b4 = 0.0;
    local_98.c1 = local_58.c1;
    local_98.c2 = local_58.c2;
    local_98.c3 = local_58.c3;
    local_98.c4 = 0.0;
    local_98.d1 = 0.0;
    local_98.d2 = 0.0;
    local_98.d3 = 0.0;
    local_98.d4 = 1.0;
    FindMeshCenterTransformed(mesh,&local_a8,&local_b8,&local_c8,&local_98);
    if (mesh->mNumVertices != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        paVar3 = mesh->mVertices;
        fVar1 = *(float *)((long)paVar3 + lVar7 + -8);
        fVar9 = *(float *)((long)paVar3 + lVar7 + -4);
        fVar13 = *(float *)((long)&paVar3->x + lVar7);
        auVar14._0_4_ =
             (fVar13 * local_98.a3 + fVar1 * local_98.a1 + fVar9 * local_98.a2 + local_98.a4) -
             local_b8.x;
        auVar14._4_4_ =
             (fVar13 * local_98.c3 + fVar1 * local_98.c1 + fVar9 * local_98.c2 + local_98.c4) -
             local_b8.z;
        auVar14._8_4_ =
             (fVar13 * local_98.b1 + fVar1 * local_98.a3 + fVar9 * local_98.a4 + local_98.b2) - 0.0;
        auVar14._12_4_ =
             (fVar13 * local_98.b2 + fVar1 * local_98.a4 + fVar9 * local_98.b1 + local_98.b3) - 0.0;
        auVar4._4_4_ = local_c8.z - local_b8.z;
        auVar4._0_4_ = local_c8.x - local_b8.x;
        auVar4._8_8_ = 0;
        auVar15 = divps(auVar14,auVar4);
        *(long *)((long)out + lVar7 + -8) = auVar15._0_8_;
        *(undefined4 *)((long)&out->x + lVar7) = 0;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xc;
      } while (uVar8 < mesh->mNumVertices);
    }
  }
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputePlaneMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    ai_real diffu,diffv;
    aiVector3D center, min, max;

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.z - min.z;
        diffv = max.y - min.y;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.z - min.z) / diffu,(pos.y - min.y) / diffv,0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.x - min.x;
        diffv = max.z - min.z;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.z - min.z) / diffv,0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.x - min.x;
        diffv = max.y - min.y;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.y - min.y) / diffv,0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else
    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);
        FindMeshCenterTransformed(mesh, center, min, max,mTrafo);
        diffu = max.x - min.x;
        diffv = max.z - min.z;

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D pos = mTrafo * mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.z - min.z) / diffv,0.0);
        }
    }

    // shouldn't be necessary to remove UV seams ...
}